

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O3

void __thiscall Tank::updateArea(Tank *this)

{
  double local_28;
  double slope;
  double intercept;
  
  if (this->volCurve != (Curve *)0x0) {
    Curve::findSegment(this->volCurve,
                       ((this->super_Node).head - (this->super_Node).elev) * this->ucfLength,
                       &local_28,&slope);
    this->area = (local_28 / this->ucfLength) / this->ucfLength;
  }
  return;
}

Assistant:

void Tank::updateArea()
{

    // ... tank has a volume curve (in original user units)

    if ( volCurve )
    {
        // ... find slope of curve segment containing depth

        double slope, intercept;
        double depth = head - elev;
        volCurve->findSegment(depth*ucfLength, slope, intercept);

        // ... curve segment slope (dV/dy) is avg. area over interval;
        //     convert to internal units

        area = slope / ucfLength / ucfLength;
    }

    // ... area of cylindrical tank remains constant
}